

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarimaxtest3.c
# Opt level: O2

int main(void)

{
  int iVar1;
  double *xpred;
  double *amse;
  FILE *__stream;
  double *pdVar2;
  double *xreg;
  double *newxreg;
  sarimax_object obj;
  long lVar3;
  long lVar4;
  int N;
  double dVar5;
  double local_70c8;
  double temp [1200];
  double temp1 [1200];
  double temp2 [1200];
  
  xpred = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/e1m.dat","r");
  if (__stream != (FILE *)0x0) {
    N = -5;
    pdVar2 = &local_70c8;
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      __isoc99_fscanf(__stream,"%lf %lf %lf \n",pdVar2);
      N = N + 1;
      pdVar2 = pdVar2 + 1;
    }
    lVar4 = (long)N;
    pdVar2 = (double *)malloc(lVar4 * 8);
    xreg = (double *)malloc(lVar4 << 4);
    newxreg = (double *)malloc(0x50);
    for (lVar3 = 0; lVar3 < lVar4; lVar3 = lVar3 + 1) {
      pdVar2[lVar3] = temp[lVar3 + -1];
      xreg[lVar3] = temp[lVar3 + 0x4af];
      xreg[lVar4 + lVar3] = temp1[lVar3 + 0x4af];
    }
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      newxreg[lVar3] = temp[lVar4 + lVar3 + 0x4af];
      newxreg[lVar3 + 5] = temp1[lVar4 + lVar3 + 0x4af];
    }
    obj = sarimax_init(2,0,2,0,0,0,0,2,1,N);
    sarimax_setMethod(obj,2);
    sarimax_exec(obj,pdVar2,xreg);
    sarimax_summary(obj);
    sarimax_predict(obj,pdVar2,xreg,5,newxreg,xpred,amse);
    putchar(10);
    printf("Predicted Values : ");
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      printf("%g ",xpred[lVar3]);
    }
    putchar(10);
    printf("Standard Errors  : ");
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      dVar5 = amse[lVar3];
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      printf("%g ",dVar5);
    }
    putchar(10);
    sarimax_free(obj);
    free(pdVar2);
    free(xpred);
    free(amse);
    free(xreg);
    free(newxreg);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main(void) {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *xpred, *amse,*xreg,*newxreg;
	sarimax_object obj;
	int imean = 1;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 2;
	d = 0;
	q = 2;
	s = 0;
	P = 0;
	D = 0;
	Q = 0;
	r = 2;


	L = 5;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/e1m.dat", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf %lf %lf \n", &temp[i],&temp1[i],&temp2[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        xreg[i] = temp1[i];
		xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        newxreg[i] = temp1[N + i];
        newxreg[i+L] = temp2[N + i];
    }

	obj = sarimax_init(p, d, q, P, D, Q, s, r ,imean, N);

    /* setMethod()
    Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
    */

	sarimax_setMethod(obj, 2); 

    /*sarimax_exec(object, input time series, exogenous time series)
        set exogenous to NULL if deadling only with a univariate time series.
    */
	sarimax_exec(obj, inp,xreg);
	sarimax_summary(obj);
	/* sarimax_predict(sarimax_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse)
        inp - Input Time Series
        xreg - Exogenous Time Series
        L - L point prediction
        newxreg - Exogenous Time Series of dimension r * L where r is the number of exogenus time series and L is the length of each
        xpred - L future values
        amse - MSE for L future values
    */
	sarimax_predict(obj, inp, xreg, L, newxreg, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");

	sarimax_free(obj);
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);
	return 0;

}